

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

void __thiscall
wabt::interp::HostFunc::HostFunc(HostFunc *this,Store *param_1,FuncType *type,Callback *callback)

{
  _Manager_type p_Var1;
  FuncType local_60;
  
  local_60.super_ExternType.kind = (type->super_ExternType).kind;
  local_60.super_ExternType._vptr_ExternType = (_func_int **)&PTR__FuncType_001880d0;
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_60.params,&type->params);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_60.results,&type->results);
  Func::Func(&this->super_Func,HostFunc,&local_60);
  local_60.super_ExternType._vptr_ExternType = (_func_int **)&PTR__FuncType_001880d0;
  if (local_60.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.results.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.results.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_60.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.params.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.params.
                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  (this->super_Func).super_Extern.super_Object._vptr_Object = (_func_int **)&PTR__HostFunc_00187f30;
  *(undefined8 *)&(this->callback_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->callback_).super__Function_base._M_functor + 8) = 0;
  (this->callback_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->callback_)._M_invoker = (_Invoker_type)0x0;
  p_Var1 = (callback->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->callback_,(_Any_data *)callback,__clone_functor);
    (this->callback_)._M_invoker = callback->_M_invoker;
    (this->callback_).super__Function_base._M_manager = (callback->super__Function_base)._M_manager;
  }
  return;
}

Assistant:

HostFunc::HostFunc(Store&, FuncType type, Callback callback)
    : Func(skind, type), callback_(callback) {}